

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

int __thiscall capnp::DynamicList::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined8 uVar2;
  Which elementType;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  undefined8 uVar5;
  ElementSize elementSize;
  undefined2 uVar6;
  StructSize elementSize_00;
  ByteCount in_ECX;
  uint in_EDX;
  ListBuilder *__return_storage_ptr__;
  Builder BVar7;
  ListSchema LVar8;
  Schema in_stack_ffffffffffffff08;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  Fault f;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  SegmentBuilder *pSStack_90;
  CapTableBuilder *local_88;
  ListBuilder local_80;
  ListBuilder local_58;
  
  _kjCondition.left = &index_local;
  uVar1 = *(uint *)(ctx + 0x28);
  _kjCondition.right = uVar1;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = in_EDX < uVar1;
  if (uVar1 <= in_EDX) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4e2,FAILED,"index < this->size()","_kjCondition,\"List index out-of-bounds.\"",
               &_kjCondition,(char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  uVar6 = 0xe;
  if (ctx[2] == (EVP_PKEY_CTX)0x0) {
    uVar6 = *(undefined2 *)ctx;
  }
  switch(uVar6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x10:
  case 0x11:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4f4,FAILED,(char *)0x0,"\"Expected a list or blob.\"",
               (char (*) [25])"Expected a list or blob.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  case 0xc:
    _kjCondition.op.content.ptr =
         (char *)(((ulong)*(uint *)(ctx + 0x2c) * (ulong)in_EDX >> 3) + *(long *)(ctx + 0x20));
    _kjCondition.left = *(uint **)(ctx + 0x10);
    _kjCondition._8_8_ = *(undefined8 *)(ctx + 0x18);
    capnp::_::PointerBuilder::initBlob<capnp::Text>
              ((Builder *)&local_98,(PointerBuilder *)&_kjCondition,in_ECX);
    (this->builder).capTable = local_88;
    (this->schema).elementType.field_4 = local_98;
    (this->builder).segment = pSStack_90;
    (this->schema).elementType.baseType = UINT8;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    break;
  case 0xd:
    _kjCondition.op.content.ptr =
         (char *)(((ulong)*(uint *)(ctx + 0x2c) * (ulong)in_EDX >> 3) + *(long *)(ctx + 0x20));
    _kjCondition.left = *(uint **)(ctx + 0x10);
    _kjCondition._8_8_ = *(undefined8 *)(ctx + 0x18);
    BVar7 = capnp::_::PointerBuilder::initBlob<capnp::Data>((PointerBuilder *)&_kjCondition,in_ECX);
    (this->schema).elementType.baseType = UINT16;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(ArrayPtr<unsigned_char> *)&(this->schema).elementType.field_4 =
         BVar7.super_ArrayPtr<unsigned_char>;
    break;
  case 0xe:
    index_local = in_EDX;
    LVar8 = Type::asList((Type *)ctx);
    f.exception = LVar8.elementType._0_8_;
    if (LVar8.elementType.baseType == STRUCT &&
        ((undefined1  [16])LVar8.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
    {
      _kjCondition.op.content.ptr =
           (char *)(((ulong)*(uint *)(ctx + 0x2c) * (ulong)index_local >> 3) + *(long *)(ctx + 0x20)
                   );
      _kjCondition.left = *(uint **)(ctx + 0x10);
      _kjCondition._8_8_ = *(undefined8 *)(ctx + 0x18);
      Type::asStruct((Type *)&f);
      elementSize_00 =
           anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffff08.raw);
      __return_storage_ptr__ = &local_58;
      capnp::_::PointerBuilder::initStructList
                (__return_storage_ptr__,(PointerBuilder *)&_kjCondition,in_ECX,elementSize_00);
    }
    else {
      _kjCondition.op.content.ptr =
           (char *)(((ulong)*(uint *)(ctx + 0x2c) * (ulong)index_local >> 3) + *(long *)(ctx + 0x20)
                   );
      _kjCondition.left = *(uint **)(ctx + 0x10);
      _kjCondition._8_8_ = *(undefined8 *)(ctx + 0x18);
      elementType = LIST;
      if (((undefined1  [16])LVar8.elementType & (undefined1  [16])0xff0000) ==
          (undefined1  [16])0x0) {
        elementType = LVar8.elementType.baseType;
      }
      elementSize = anon_unknown_71::elementSizeFor(elementType);
      __return_storage_ptr__ = &local_80;
      capnp::_::PointerBuilder::initList
                (__return_storage_ptr__,(PointerBuilder *)&_kjCondition,elementSize,in_ECX);
    }
    uVar2._0_4_ = __return_storage_ptr__->structDataSize;
    uVar2._4_2_ = __return_storage_ptr__->structPointerCount;
    uVar2._6_1_ = __return_storage_ptr__->elementSize;
    uVar2._7_1_ = __return_storage_ptr__->field_0x27;
    this[1].schema.elementType.baseType = (short)(undefined4)uVar2;
    this[1].schema.elementType.listDepth = (char)((ulong)uVar2 >> 0x10);
    this[1].schema.elementType.isImplicitParam = (bool)(char)((ulong)uVar2 >> 0x18);
    this[1].schema.elementType.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar2 >> 0x20);
    *(short *)&this[1].schema.elementType.field_0x6 = (short)((ulong)uVar2 >> 0x30);
    pSVar3 = __return_storage_ptr__->segment;
    pCVar4 = __return_storage_ptr__->capTable;
    uVar5._0_4_ = __return_storage_ptr__->elementCount;
    uVar5._4_4_ = __return_storage_ptr__->step;
    *(byte **)&(this->builder).elementCount = __return_storage_ptr__->ptr;
    (this->builder).structDataSize = (undefined4)uVar5;
    (this->builder).structPointerCount = (short)((ulong)uVar5 >> 0x20);
    (this->builder).elementSize = (char)((ulong)uVar5 >> 0x30);
    (this->builder).field_0x27 = (char)((ulong)uVar5 >> 0x38);
    (this->builder).capTable = (CapTableBuilder *)pSVar3;
    (this->builder).ptr = (byte *)pCVar4;
    (this->schema).elementType.baseType = UINT32;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(Type *)&(this->schema).elementType.field_4 = LVar8.elementType;
    break;
  case 0x12:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x510,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  default:
    (this->schema).elementType.baseType = VOID;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
  }
  return (int)this;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::init(uint index, uint size) {
  KJ_REQUIRE(index < this->size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("Expected a list or blob.");
      return nullptr;

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Text>(bounded(size) * BYTES);

    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Data>(bounded(size) * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();

      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initStructList(bounded(size) * ELEMENTS,
                                   structSizeFromSchema(elementType.getStructElementType())));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initList(elementSizeFor(elementType.whichElementType()),
                             bounded(size) * ELEMENTS));
      }
    }

    case schema::Type::ANY_POINTER: {
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;
    }
  }

  return nullptr;
}